

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.hpp
# Opt level: O3

void __thiscall
mp::StringFileWriter::Write<std::pair<char_const*,double>>
          (StringFileWriter *this,pair<const_char_*,_double> s)

{
  size_t sVar1;
  
  if (this->fTriedOpen_ == false) {
    Open(this);
  }
  this->cnt_ = this->cnt_ + 1;
  File::Printf(&this->nm,"%s\t%.17g\n",s.second,s.first);
  sVar1 = strlen(s.first);
  if (*this->len_max_ < (int)sVar1) {
    *this->len_max_ = (int)sVar1;
  }
  return;
}

Assistant:

void Write(Value s) {
    if (!fTriedOpen_)
      Open();
    ++cnt_;
    auto l = Print_ReturnLen1(s);
    if (l>len_max_)
      len_max_ = l;
  }